

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgcrd(fitsfile *fptr,char *name,char *card,int *status)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int *in_RCX;
  char *in_RDX;
  long in_RSI;
  bool bVar4;
  char *gotstar;
  char *ptr2;
  char *ptr1;
  char cardname [75];
  char keyname [75];
  int hier;
  int exact;
  int match;
  int wild;
  int kk;
  int jj;
  int ii;
  int cardlen;
  int namelenminus1;
  int namelen_limit;
  int namelen;
  int ntodo;
  int nextkey;
  int nkeys;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  int local_130;
  int local_12c;
  int local_128;
  int *status_00;
  int *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  char in_stack_fffffffffffffef8;
  undefined7 in_stack_fffffffffffffef9;
  int *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  char cVar5;
  undefined7 in_stack_ffffffffffffff49;
  int local_b0 [12];
  int *in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  int iVar6;
  undefined4 in_stack_ffffffffffffffa4;
  int local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  local_48 = 0;
  iVar6 = 0;
  if (*in_RCX < 1) {
    cVar5 = '\0';
    for (; *(char *)(in_RSI + local_48) == ' '; local_48 = local_48 + 1) {
    }
    strncat(&stack0xffffffffffffff48,(char *)(in_RSI + local_48),0x4a);
    sVar2 = strlen(&stack0xffffffffffffff48);
    local_38 = (int)sVar2;
    while( true ) {
      bVar4 = false;
      if (0 < local_38) {
        bVar4 = *(char *)((long)local_b0 + (long)(local_38 + -1) + -8) == ' ';
      }
      if (!bVar4) break;
      local_38 = local_38 + -1;
    }
    *(undefined1 *)((long)local_b0 + (long)local_38 + -8) = 0;
    for (local_48 = 0; local_48 < local_38; local_48 = local_48 + 1) {
      iVar1 = toupper((int)*(char *)((long)local_b0 + (long)local_48 + -8));
      *(char *)((long)local_b0 + (long)local_48 + -8) = (char)iVar1;
    }
    if (cVar5 < 'I') {
      if (cVar5 < 'H') {
        local_12c = 1;
      }
      else {
        local_12c = strncmp("HIERARCH",&stack0xffffffffffffff48,8);
      }
      local_128 = local_12c;
    }
    else {
      local_128 = -1;
    }
    if (local_128 == 0) {
      if (local_38 == 8) {
        iVar6 = 1;
      }
      else {
        in_stack_fffffffffffffef0 = &stack0xffffffffffffff48;
        for (in_stack_fffffffffffffee8 = local_b0; (char)*in_stack_fffffffffffffee8 == ' ';
            in_stack_fffffffffffffee8 = (int *)((long)in_stack_fffffffffffffee8 + 1)) {
        }
        local_38 = 0;
        for (; (char)*in_stack_fffffffffffffee8 != '\0';
            in_stack_fffffffffffffee8 = (int *)((long)in_stack_fffffffffffffee8 + 1)) {
          *in_stack_fffffffffffffef0 = (char)*in_stack_fffffffffffffee8;
          in_stack_fffffffffffffef0 = in_stack_fffffffffffffef0 + 1;
          local_38 = local_38 + 1;
        }
        *in_stack_fffffffffffffef0 = '\0';
      }
    }
    local_3c = local_38;
    status_00 = (int *)0x0;
    if ((local_38 < 9) &&
       (((pcVar3 = strchr(&stack0xffffffffffffff48,0x3f), pcVar3 != (char *)0x0 ||
         (status_00 = (int *)strchr(&stack0xffffffffffffff48,0x2a), status_00 != (int *)0x0)) ||
        (pcVar3 = strchr(&stack0xffffffffffffff48,0x23), pcVar3 != (char *)0x0)))) {
      bVar4 = true;
      if (status_00 != (int *)0x0) {
        local_3c = local_38 + -2;
      }
    }
    else {
      bVar4 = false;
    }
    ffghps((fitsfile *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
           (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
           (int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),(int *)0x1bc79f);
    if (local_38 + -1 < 2) {
      local_130 = 1;
    }
    else {
      local_130 = local_38 + -1;
    }
    local_34 = (local_2c - local_30) + 1;
    for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
      for (local_50 = 0; local_50 < local_34; local_50 = local_50 + 1) {
        ffgnky((fitsfile *)CONCAT71(in_stack_ffffffffffffff49,cVar5),in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
        if (iVar6 == 0) {
          ffgknm((char *)CONCAT71(in_stack_fffffffffffffef9,in_stack_fffffffffffffef8),
                 in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,status_00);
          if ((local_3c <= local_44) && ((bVar4 || (local_44 == local_38)))) {
            for (local_48 = 0; local_48 < local_44; local_48 = local_48 + 1) {
              if ('`' < (char)(&stack0xfffffffffffffef8)[local_48]) {
                iVar1 = toupper((int)(char)(&stack0xfffffffffffffef8)[local_48]);
                (&stack0xfffffffffffffef8)[local_48] = (char)iVar1;
              }
            }
            if (bVar4) {
              ffcmps((char *)CONCAT44(in_stack_ffffffffffffffa4,iVar6),in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
              if (local_58 != 0) {
                return *in_RCX;
              }
            }
            else if (*(char *)((long)local_b0 + (long)local_130 + -8) ==
                     (&stack0xfffffffffffffef8)[local_130]) {
              if (cVar5 < in_stack_fffffffffffffef8) {
                in_stack_fffffffffffffec4 = -1;
              }
              else if (in_stack_fffffffffffffef8 < cVar5) {
                in_stack_fffffffffffffec0 = 1;
                in_stack_fffffffffffffec4 = in_stack_fffffffffffffec0;
              }
              else {
                in_stack_fffffffffffffec0 =
                     strncmp(&stack0xffffffffffffff48,&stack0xfffffffffffffef8,(long)local_130);
                in_stack_fffffffffffffec4 = in_stack_fffffffffffffec0;
              }
              if (in_stack_fffffffffffffec4 == 0) {
                return *in_RCX;
              }
            }
            else if ((local_38 == 0) && (local_44 == 0)) {
              return *in_RCX;
            }
          }
        }
        else {
          if (*in_RDX < 'I') {
            if (*in_RDX < 'H') {
              iVar1 = 1;
            }
            else {
              iVar1 = strncmp("HIERARCH",in_RDX,8);
            }
          }
          else {
            iVar1 = -1;
          }
          if (iVar1 == 0) {
            return *in_RCX;
          }
        }
      }
      if ((bVar4) || (local_4c == 1)) break;
      ffmaky((fitsfile *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffebc,(int *)0x1bcb02);
      local_34 = local_30 + -1;
    }
    *in_RCX = 0xca;
    local_4 = 0xca;
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffgcrd( fitsfile *fptr,     /* I - FITS file pointer        */
            const char *name,         /* I - name of keyword to read  */
            char *card,         /* O - keyword card             */
            int  *status)       /* IO - error status            */
/*
  Read (get) the named keyword, returning the entire keyword card up to
  80 characters long.  
  The returned card value is null terminated with any trailing blank 
  characters removed.

  If the input name contains wild cards ('?' matches any single char
  and '*' matches any sequence of chars, # matches any string of decimal
  digits) then the search ends once the end of header is reached and does 
  not automatically resume from the top of the header.
*/
{
    int nkeys, nextkey, ntodo, namelen, namelen_limit, namelenminus1, cardlen;
    int ii = 0, jj, kk, wild, match, exact, hier = 0;
    char keyname[FLEN_KEYWORD], cardname[FLEN_KEYWORD];
    char *ptr1, *ptr2, *gotstar;

    if (*status > 0)
        return(*status);

    *keyname = '\0';
    
    while (name[ii] == ' ')  /* skip leading blanks in name */
        ii++;

    strncat(keyname, &name[ii], FLEN_KEYWORD - 1);

    namelen = strlen(keyname);

    while (namelen > 0 && keyname[namelen - 1] == ' ')
         namelen--;            /* ignore trailing blanks in name */

    keyname[namelen] = '\0';  /* terminate the name */

    for (ii=0; ii < namelen; ii++)       
        keyname[ii] = toupper(keyname[ii]);    /*  make upper case  */

    if (FSTRNCMP("HIERARCH", keyname, 8) == 0)
    {
        if (namelen == 8)
        {
            /* special case: just looking for any HIERARCH keyword */
            hier = 1;
        }
        else
        {
            /* ignore the leading HIERARCH and look for the 'real' name */
            /* starting with first non-blank character following HIERARCH */
            ptr1 = keyname;
            ptr2 = &keyname[8];

            while(*ptr2 == ' ')
                ptr2++;

            namelen = 0;
            while(*ptr2)
            {
                *ptr1 = *ptr2;
                 ptr1++;
                 ptr2++;
                 namelen++;
            }
            *ptr1 = '\0';
        }
    }

    /* does input name contain wild card chars?  ('?',  '*', or '#') */
    /* wild cards are currently not supported with HIERARCH keywords */

    namelen_limit = namelen;
    gotstar = 0;
    if (namelen < 9 && 
       (strchr(keyname,'?') || (gotstar = strchr(keyname,'*')) || 
        strchr(keyname,'#')) )
    {
        wild = 1;

        /* if we found a '*' wild card in the name, there might be */
        /* more than one.  Support up to 2 '*' in the template. */
        /* Thus we need to compare keywords whose names have at least */
        /* namelen - 2 characters.                                   */
        if (gotstar)
           namelen_limit -= 2;           
    }
    else
        wild = 0;

    ffghps(fptr, &nkeys, &nextkey, status); /* get no. keywords and position */

    namelenminus1 = maxvalue(namelen - 1, 1);
    ntodo = nkeys - nextkey + 1;  /* first, read from next keyword to end */
    for (jj=0; jj < 2; jj++)
    {
      for (kk = 0; kk < ntodo; kk++)
      {
        ffgnky(fptr, card, status);     /* get next keyword */

        if (hier)
        {
           if (FSTRNCMP("HIERARCH", card, 8) == 0)
                return(*status);  /* found a HIERARCH keyword */
        }
        else
        {
          ffgknm(card, cardname, &cardlen, status); /* get the keyword name */

          if (cardlen >= namelen_limit)  /* can't match if card < name */
          { 
            /* if there are no wild cards, lengths must be the same */
            if (!( !wild && cardlen != namelen) )
            {
              for (ii=0; ii < cardlen; ii++)
              {    
                /* make sure keyword is in uppercase */
                if (cardname[ii] > 96)
                {
                  /* This assumes the ASCII character set in which */
                  /* upper case characters start at ASCII(97)  */
                  /* Timing tests showed that this is 20% faster */
                  /* than calling the isupper function.          */

                  cardname[ii] = toupper(cardname[ii]);  /* make upper case */
                }
              }

              if (wild)
              {
                ffcmps(keyname, cardname, 1, &match, &exact);
                if (match)
                    return(*status); /* found a matching keyword */
              }
              else if (keyname[namelenminus1] == cardname[namelenminus1])
              {
                /* test the last character of the keyword name first, on */
                /* the theory that it is less likely to match then the first */
                /* character since many keywords begin with 'T', for example */

                if (FSTRNCMP(keyname, cardname, namelenminus1) == 0)
                {
                  return(*status);   /* found the matching keyword */
                }
              }
	      else if (namelen == 0 && cardlen == 0)
	      {
	         /* matched a blank keyword */
		 return(*status);
	      }
            }
          }
        }
      }

      if (wild || jj == 1)
            break;  /* stop at end of header if template contains wildcards */

      ffmaky(fptr, 1, status);  /* reset pointer to beginning of header */
      ntodo = nextkey - 1;      /* number of keyword to read */ 
    }

    return(*status = KEY_NO_EXIST);  /* couldn't find the keyword */
}